

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp8l_enc.c
# Opt level: O1

int EncodeStreamHook(void *input,void *data2)

{
  uint32_t color;
  int iVar1;
  uint uVar2;
  code *pcVar3;
  WebPConfig *pWVar4;
  uint8_t *puVar5;
  uint32_t *puVar6;
  undefined4 uVar7;
  int iVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int max_bits;
  uint8_t *puVar12;
  undefined1 *puVar13;
  VP8LHistogramSet *image_histo;
  VP8LHistogram *tmp_histo;
  HuffmanTreeCode *pHVar14;
  long lVar15;
  byte bVar16;
  uint uVar17;
  uint32_t uVar18;
  int iVar19;
  int height;
  uint32_t *puVar20;
  ulong uVar21;
  uint32_t *puVar22;
  WebPPicture *pWVar23;
  uint64_t nmemb;
  HuffmanTreeToken *ptr;
  int iVar24;
  uint uVar25;
  HuffmanTreeCode *in_R9;
  VP8LBitWriter *pVVar26;
  long lVar27;
  uint16_t uVar28;
  uint32_t uVar29;
  uint32_t uVar30;
  HuffmanTree *pHVar31;
  ulong uVar32;
  VP8LEncoder *pVVar33;
  uint32_t *puVar34;
  bool bVar35;
  byte bVar36;
  int percent;
  long local_1a00;
  ulong local_19f8;
  uint32_t *local_19f0;
  WebPPicture *local_19e8;
  ulong local_19e0;
  HuffmanTreeToken *local_19d8;
  uint32_t *local_19d0;
  VP8LEncoder *local_19c8;
  VP8LBitWriter *local_19c0;
  long local_19b8;
  long local_19b0;
  uint local_19a4;
  HuffmanTreeCode *local_19a0;
  ulong local_1998;
  ulong local_1990;
  int local_1984;
  HuffmanTreeCode *local_1980;
  uint32_t *local_1978;
  ulong local_1970;
  uint local_1964;
  HuffmanTree *local_1960;
  long local_1958;
  VP8LBackwardRefs *local_1950;
  VP8LHashChain *local_1948;
  int local_193c;
  int local_1938;
  uint local_1934;
  long local_1930;
  uint8_t *local_1928;
  ulong local_1920;
  int local_1914;
  int local_1910;
  int local_190c;
  int local_1908;
  uint local_1904;
  int local_1900;
  int cache_bits_best;
  ulong local_18f8;
  uint32_t *local_18f0;
  void *local_18e8;
  ulong local_18e0;
  ulong local_18d8;
  VP8LBackwardRefs *local_18d0;
  ulong local_18c8;
  VP8LBackwardRefs *local_18c0;
  long local_18b8;
  ulong local_18b0;
  uint32_t *local_18a8;
  VP8LBackwardRefs *local_18a0;
  VP8LBitWriter bw_best;
  VP8LBitWriter bw_init;
  uint32_t idx_map [256];
  VP8LHashChain hash_chain_histogram;
  uint16_t buffer [2048];
  
  lVar15 = *input;
  local_19e8 = *(WebPPicture **)((long)input + 8);
  pVVar26 = *(VP8LBitWriter **)((long)input + 0x10);
  pVVar33 = *(VP8LEncoder **)((long)input + 0x18);
  uVar17 = *(uint *)((long)input + 0x1a8);
  uVar21 = (ulong)uVar17;
  local_1908 = *(int *)((long)input + 0x1ac);
  local_18b8 = *(long *)((long)input + 0x1b0);
  local_1970 = (ulong)(uint)(int)*(float *)(lVar15 + 4);
  local_1900 = *(int *)(lVar15 + 8);
  local_19a0 = (HuffmanTreeCode *)0x0;
  bVar35 = local_1900 == 0;
  local_190c = local_19e8->width;
  local_1990 = (ulong)(uint)local_19e8->height;
  local_1930 = (long)pVVar26->cur_ - (long)pVVar26->buf_;
  iVar10 = pVVar26->used_;
  percent = 2;
  bw_init.bits_ = pVVar26->bits_;
  bw_init.used_ = pVVar26->used_;
  bw_init._12_4_ = *(undefined4 *)&pVVar26->field_0xc;
  bw_init.buf_ = pVVar26->buf_;
  bw_init.cur_ = pVVar26->cur_;
  bw_init.end_ = pVVar26->end_;
  bw_init.error_ = pVVar26->error_;
  bw_init._44_4_ = *(undefined4 *)&pVVar26->field_0x2c;
  local_18e8 = input;
  iVar8 = VP8LBitWriterInit(&bw_best,0);
  if ((iVar8 == 0) ||
     ((1 < (int)uVar17 && (iVar8 = VP8LBitWriterClone(pVVar26,&bw_best), iVar8 == 0)))) {
    WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
  }
  else {
    local_1920 = uVar21;
    if (0 < (int)uVar17) {
      lVar27 = (long)local_18e8 + 0x20;
      local_19a0 = (HuffmanTreeCode *)CONCAT71((int7)((ulong)local_19a0 >> 8),bVar35);
      local_1930 = local_1930 + (ulong)(uint)(iVar10 + 7 >> 3);
      local_1950 = pVVar33->refs_;
      local_18a0 = pVVar33->refs_ + 1;
      local_18a8 = pVVar33->palette_sorted_;
      local_1978 = pVVar33->palette_;
      local_1904 = (uint)(0x61 / uVar21);
      local_18b0 = 0x61 / uVar21 >> 2;
      local_1948 = &pVVar33->hash_chain_;
      local_1934 = local_1904 - (int)local_18b0;
      local_1984 = (int)local_1990 + -1;
      local_18d0 = pVVar33->refs_ + 2;
      local_1928 = (uint8_t *)0xffffffffffffffff;
      uVar21 = 0;
      local_193c = 0;
      local_1938 = 0;
      local_19c8 = pVVar33;
      local_19c0 = pVVar26;
      local_19b8 = lVar27;
      local_19b0 = lVar15;
      do {
        uVar17 = *(uint *)(lVar27 + uVar21 * 0x1c);
        uVar9 = uVar17 & 0xfffffffe;
        pVVar33->use_palette_ = (uint)(uVar9 == 4);
        pVVar33->use_subtract_green_ = (uint)(uVar9 == 2);
        uVar17 = (uint)(uVar17 == 5 || (uVar17 & 0xfffffffd) == 1);
        pVVar33->use_predict_ = uVar17;
        if ((local_1900 == 0) || (uVar9 == 4)) {
          pVVar33->use_cross_color_ = 0;
        }
        else {
          if (local_1908 != 0) {
            uVar17 = 0;
          }
          pVVar33->use_cross_color_ = uVar17;
        }
        pVVar33->cache_bits_ = 0;
        local_19e0 = uVar21;
        VP8LBackwardRefsClear(local_1950);
        VP8LBackwardRefsClear(local_18a0);
        if (((*(int *)(lVar15 + 0x5c) < 100) && (pVVar33->use_palette_ == 0)) &&
           (pVVar33->use_predict_ == 0)) {
          iVar10 = AllocateTransformBuffer(pVVar33,local_190c,(int)local_1990);
          if (iVar10 != 0) {
            if ((pVVar33->argb_content_ == kEncoderNearLossless) ||
               (iVar10 = VP8ApplyNearLossless(local_19e8,*(int *)(lVar15 + 0x5c),pVVar33->argb_),
               pWVar23 = local_19e8, iVar10 != 0)) {
              pVVar33->argb_content_ = kEncoderNearLossless;
              goto LAB_0013a773;
            }
LAB_0013aa6c:
            WebPEncodingSetError(pWVar23,VP8_ENC_ERROR_OUT_OF_MEMORY);
          }
LAB_0013bc4a:
          bVar35 = false;
        }
        else {
          pVVar33->argb_content_ = kEncoderNone;
LAB_0013a773:
          local_1958 = uVar21 * 0x1c + lVar27;
          uVar21 = (ulong)local_1904;
          puVar20 = local_1978;
          if (pVVar33->use_palette_ == 0) {
LAB_0013ae95:
            iVar10 = (int)puVar20;
            local_19d0 = (uint32_t *)uVar21;
            if ((pVVar33->argb_content_ & ~kEncoderARGB) == kEncoderNearLossless) {
LAB_0013af32:
              puVar20 = local_19d0;
              if (pVVar33->use_subtract_green_ != 0) {
                iVar8 = pVVar33->current_width_;
                if (0x1f < pVVar26->used_) {
                  VP8LPutBitsFlushBits(pVVar26);
                }
                iVar19 = pVVar26->used_;
                pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar19 & 0x3f);
                pVVar26->used_ = iVar19 + 1;
                if (0x1e < iVar19) {
                  VP8LPutBitsFlushBits(pVVar26);
                }
                pVVar26->bits_ = pVVar26->bits_ | 2L << ((byte)pVVar26->used_ & 0x3f);
                pVVar26->used_ = pVVar26->used_ + 2;
                (*VP8LSubtractGreenFromBlueAndRed)(pVVar33->argb_,iVar8 * (int)local_1990);
              }
              iVar8 = (int)in_R9;
              if (pVVar33->use_predict_ == 0) {
LAB_0013b1c9:
                if (pVVar33->use_cross_color_ != 0) {
                  iVar10 = pVVar33->current_width_;
                  in_R9 = (HuffmanTreeCode *)pVVar33->transform_data_;
                  iVar8 = (int)puVar20;
                  iVar19 = iVar8 + 3;
                  if (-1 < iVar8) {
                    iVar19 = iVar8;
                  }
                  iVar11 = VP8LColorSpaceTransform
                                     (iVar10,(int)local_1990,pVVar33->cross_color_transform_bits_,
                                      (int)local_1970,pVVar33->argb_,(uint32_t *)in_R9,pVVar33->pic_
                                      ,iVar19 >> 2,&percent,(int *)buffer);
                  pVVar33 = local_19c8;
                  if (iVar11 != 0) {
                    if (0x1f < pVVar26->used_) {
                      VP8LPutBitsFlushBits(pVVar26);
                    }
                    iVar11 = pVVar26->used_;
                    pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar11 & 0x3f);
                    pVVar26->used_ = iVar11 + 1;
                    if (0x1e < iVar11) {
                      VP8LPutBitsFlushBits(pVVar26);
                    }
                    iVar11 = pVVar26->used_;
                    pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar11 & 0x3f);
                    pVVar26->used_ = iVar11 + 2;
                    uVar7 = buffer._0_4_;
                    if (0x1d < iVar11) {
                      VP8LPutBitsFlushBits(pVVar26);
                    }
                    pVVar33 = local_19c8;
                    pVVar26->bits_ =
                         pVVar26->bits_ | (ulong)(uVar7 - 2) << ((byte)pVVar26->used_ & 0x3f);
                    pVVar26->used_ = pVVar26->used_ + 3;
                    bVar36 = (byte)buffer._0_8_;
                    iVar24 = 1 << (bVar36 & 0x1f);
                    iVar11 = (int)(((uint)((ulong)puVar20 >> 0x1f) & 1) + iVar8) >> 1;
                    uVar17 = (uint)(iVar24 + local_1984) >> (bVar36 & 0x1f);
                    in_R9 = (HuffmanTreeCode *)(ulong)uVar17;
                    local_19c8->cross_color_transform_bits_ = buffer._0_4_;
                    iVar10 = EncodeImageNoHuffman
                                       (pVVar26,local_19c8->transform_data_,local_1948,local_1950,
                                        (iVar10 + iVar24) - 1U >> (bVar36 & 0x1f),uVar17,
                                        (int)local_1970,(int)local_19a0,local_19c8->pic_,
                                        iVar11 - (iVar19 >> 2),&percent);
                    lVar27 = local_19b8;
                    if (iVar10 != 0) {
                      puVar20 = (uint32_t *)(ulong)(uint)(iVar8 - iVar11);
                      goto LAB_0013b36f;
                    }
                  }
                  goto LAB_0013bd75;
                }
LAB_0013b36f:
                local_19d0 = puVar20;
                if (0x1f < pVVar26->used_) {
                  VP8LPutBitsFlushBits(pVVar26);
                }
                iVar10 = percent;
                pVVar26->used_ = pVVar26->used_ + 1;
                local_1964 = pVVar33->histo_bits_;
                bVar36 = (byte)local_1964;
                iVar8 = 1 << (bVar36 & 0x1f);
                local_19f8 = (ulong)(uint)pVVar33->current_width_;
                local_18f0 = pVVar33->argb_;
                puVar20 = (uint32_t *)
                          (ulong)(((uint)(iVar8 + local_1984) >> (bVar36 & 0x1f)) *
                                 ((pVVar33->current_width_ + iVar8) - 1U >> (bVar36 & 0x1f)));
                pHVar31 = (HuffmanTree *)WebPSafeMalloc(0x39,0x10);
                local_19f0 = puVar20;
                puVar20 = (uint32_t *)WebPSafeMalloc((uint64_t)puVar20,4);
                buffer._0_8_ = pVVar26->bits_;
                buffer._8_8_ = *(undefined8 *)&pVVar26->used_;
                buffer._16_8_ = pVVar26->buf_;
                buffer._24_8_ = pVVar26->cur_;
                buffer._32_8_ = pVVar26->end_;
                buffer._40_8_ = *(undefined8 *)&pVVar26->error_;
                hash_chain_histogram.offset_length_ = (uint32_t *)0x0;
                hash_chain_histogram.size_ = 0;
                hash_chain_histogram._12_4_ = 0;
                iVar8 = VP8LBitWriterInit((VP8LBitWriter *)idx_map,0);
                local_1960 = pHVar31;
                if ((((iVar8 == 0) || (pHVar31 == (HuffmanTree *)0x0)) ||
                    (puVar20 == (uint32_t *)0x0)) ||
                   (iVar8 = VP8LHashChainInit(&hash_chain_histogram,(int)local_19f0), iVar8 == 0)) {
LAB_0013bbb9:
                  WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
LAB_0013bbc8:
                  pHVar14 = (HuffmanTreeCode *)0x0;
                  tmp_histo = (VP8LHistogram *)0x0;
                  image_histo = (VP8LHistogramSet *)0x0;
                  ptr = (HuffmanTreeToken *)0x0;
                }
                else {
                  local_1914 = iVar10;
                  iVar10 = (int)local_19d0 / 5;
                  in_R9 = local_19a0;
                  iVar8 = VP8LHashChainFill(local_1948,(int)local_1970,local_18f0,(int)local_19f8,
                                            (int)local_1990,(int)local_19a0,local_19e8,iVar10,
                                            &percent);
                  if (iVar8 == 0) goto LAB_0013bbc8;
                  uVar17 = pVVar33->cache_bits_;
                  if (pVVar33->cache_bits_ == 0) {
                    uVar17 = 10;
                  }
                  local_18c8 = (ulong)uVar17;
                  if (((1 < *(int *)(local_1958 + 0x18)) || (*(int *)(local_1958 + 0xc) != 0)) &&
                     (iVar8 = VP8LBitWriterClone(pVVar26,(VP8LBitWriter *)idx_map), iVar8 == 0))
                  goto LAB_0013bbb9;
                  uVar21 = (ulong)*(uint *)(local_1958 + 0x18);
                  if ((int)*(uint *)(local_1958 + 0x18) < 1) {
                    local_19d8 = (HuffmanTreeToken *)0x0;
                    pHVar14 = (HuffmanTreeCode *)0x0;
                    tmp_histo = (VP8LHistogram *)0x0;
                    image_histo = (VP8LHistogramSet *)0x0;
                  }
                  else {
                    local_18d8 = (ulong)((int)local_19f8 - 1);
                    local_1910 = (int)local_19d0 - iVar10;
                    local_18f8 = 0xffffffffffffffff;
                    lVar15 = 0;
                    image_histo = (VP8LHistogramSet *)0x0;
                    tmp_histo = (VP8LHistogram *)0x0;
                    pHVar14 = (HuffmanTreeCode *)0x0;
                    local_19d8 = (HuffmanTreeToken *)0x0;
                    do {
                      iVar8 = local_1910 / (int)uVar21;
                      iVar10 = iVar8 + 3;
                      if (-1 < iVar8) {
                        iVar10 = iVar8;
                      }
                      uVar17 = *(uint *)(local_1958 + 8 + lVar15 * 8);
                      in_R9 = (HuffmanTreeCode *)(ulong)uVar17;
                      local_1a00 = lVar15;
                      iVar19 = VP8LGetBackwardReferences
                                         ((int)local_19f8,(int)local_1990,local_18f0,(int)local_1970
                                          ,(int)local_19a0,uVar17,(int)local_18c8,
                                          *(int *)(local_1958 + 0xc + lVar15 * 8),local_1948,
                                          local_1950,&cache_bits_best,local_19e8,iVar10 >> 2,
                                          &percent);
                      lVar15 = local_1a00;
                      if (iVar19 != 0) {
                        local_1998 = (ulong)(uint)(iVar8 - (iVar10 >> 2));
                        lVar27 = 0;
                        uVar17 = local_1964;
                        do {
                          uVar21 = 0;
                          if (lVar27 == 0) {
                            uVar21 = (ulong)(uint)cache_bits_best;
                          }
                          bVar16 = 6;
                          local_19a4 = uVar17;
                          if (lVar27 != 1 || cache_bits_best != 0) {
                            VP8LBitWriterReset((VP8LBitWriter *)buffer,local_19c0);
                            iVar10 = (int)uVar21;
                            image_histo = VP8LAllocateHistogramSet((int)local_19f0,iVar10);
                            tmp_histo = VP8LAllocateHistogram(iVar10);
                            if ((image_histo == (VP8LHistogramSet *)0x0) ||
                               (tmp_histo == (VP8LHistogram *)0x0)) {
                              WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
                              bVar16 = 2;
                              lVar15 = local_1a00;
                            }
                            else {
                              iVar8 = (int)local_1998 / 3;
                              local_1998 = (ulong)(uint)((int)local_1998 - iVar8);
                              local_18c0 = local_1950 + lVar27;
                              in_R9 = (HuffmanTreeCode *)(ulong)local_19a4;
                              iVar8 = VP8LGetHistoImageSymbols
                                                ((int)local_19f8,(int)local_1990,local_18c0,
                                                 (int)local_1970,(int)local_19a0,local_19a4,iVar10,
                                                 image_histo,tmp_histo,puVar20,local_19e8,iVar8,
                                                 &percent);
                              bVar16 = 2;
                              lVar15 = local_1a00;
                              if (iVar8 != 0) {
                                pHVar14 = (HuffmanTreeCode *)
                                          WebPSafeCalloc((ulong)(uint)(image_histo->size * 5),0x18);
                                if ((pHVar14 == (HuffmanTreeCode *)0x0) ||
                                   (iVar8 = GetHuffBitLengthsAndCodes(image_histo,pHVar14),
                                   iVar8 == 0)) {
                                  WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
                                }
                                else {
                                  local_1980 = pHVar14;
                                  VP8LFreeHistogramSet(image_histo);
                                  VP8LFreeHistogram(tmp_histo);
                                  pVVar26 = local_19c0;
                                  if (iVar10 < 1) {
                                    if (0x1f < local_19c0->used_) {
                                      VP8LPutBitsFlushBits(local_19c0);
                                    }
                                    iVar8 = pVVar26->used_ + 1;
                                  }
                                  else {
                                    if (0x1f < local_19c0->used_) {
                                      VP8LPutBitsFlushBits(local_19c0);
                                    }
                                    iVar8 = pVVar26->used_;
                                    pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar8 & 0x3f);
                                    pVVar26->used_ = iVar8 + 1;
                                    if (0x1e < iVar8) {
                                      VP8LPutBitsFlushBits(pVVar26);
                                    }
                                    pVVar26->bits_ =
                                         pVVar26->bits_ | uVar21 << ((byte)pVVar26->used_ & 0x3f);
                                    iVar8 = pVVar26->used_ + 4;
                                  }
                                  pVVar26->used_ = iVar8;
                                  if (local_19f0 == (uint32_t *)0x0) {
                                    uVar9 = 0;
                                  }
                                  else {
                                    puVar34 = (uint32_t *)0x0;
                                    uVar9 = 0;
                                    do {
                                      uVar25 = puVar20[(long)puVar34];
                                      if (uVar9 <= uVar25) {
                                        uVar9 = uVar25 + 1;
                                      }
                                      puVar20[(long)puVar34] = uVar25 << 8;
                                      puVar34 = (uint32_t *)((long)puVar34 + 1);
                                    } while (local_19f0 != puVar34);
                                  }
                                  if (0x1f < pVVar26->used_) {
                                    VP8LPutBitsFlushBits(pVVar26);
                                  }
                                  pVVar26->bits_ =
                                       pVVar26->bits_ |
                                       (ulong)(1 < uVar9) << ((byte)pVVar26->used_ & 0x3f);
                                  pVVar26->used_ = pVVar26->used_ + 1;
                                  if (uVar9 < 2) {
LAB_0013b968:
                                    iVar8 = uVar9 * 5;
                                    if (uVar9 == 0) {
                                      nmemb = 0;
                                    }
                                    else {
                                      lVar15 = 0;
                                      uVar25 = 0;
                                      do {
                                        uVar2 = *(uint *)((long)&local_1980->num_symbols + lVar15);
                                        if ((int)uVar2 < (int)uVar25) {
                                          uVar2 = uVar25;
                                        }
                                        uVar25 = uVar2;
                                        lVar15 = lVar15 + 0x18;
                                      } while ((ulong)(iVar8 + (uint)(iVar8 == 0)) * 0x18 != lVar15)
                                      ;
                                      nmemb = (uint64_t)uVar25;
                                    }
                                    local_19d8 = (HuffmanTreeToken *)WebPSafeMalloc(nmemb,2);
                                    pHVar31 = local_1960;
                                    pVVar26 = local_19c0;
                                    if (local_19d8 == (HuffmanTreeToken *)0x0) {
                                      WebPEncodingSetError(local_19e8,VP8_ENC_ERROR_OUT_OF_MEMORY);
                                      bVar16 = 2;
                                    }
                                    else {
                                      bVar16 = 0;
                                      if (uVar9 != 0) {
                                        uVar21 = (ulong)(iVar8 + (uint)(iVar8 == 0));
                                        pHVar14 = local_1980;
                                        do {
                                          StoreHuffmanCode(pVVar26,pHVar31,local_19d8,pHVar14);
                                          ClearHuffmanTreeIfOnlyOneSymbol(pHVar14);
                                          pHVar14 = pHVar14 + 1;
                                          uVar21 = uVar21 - 1;
                                        } while (uVar21 != 0);
                                        bVar16 = 0;
                                        uVar17 = local_1964;
                                      }
                                    }
                                    pVVar26 = local_19c0;
                                    if (local_19d8 == (HuffmanTreeToken *)0x0) {
                                      tmp_histo = (VP8LHistogram *)0x0;
                                      image_histo = (VP8LHistogramSet *)0x0;
                                      pHVar14 = local_1980;
                                      lVar15 = local_1a00;
                                    }
                                    else {
                                      puVar12 = local_19c0->cur_;
                                      local_18e0 = (ulong)(uint)local_19c0->used_;
                                      puVar5 = local_19c0->buf_;
                                      iVar8 = (int)local_1930;
                                      in_R9 = local_1980;
                                      iVar19 = StoreImageToBitMask(local_19c0,(int)local_19f8,
                                                                   local_19a4,local_18c0,puVar20,
                                                                   local_1980,local_19e8);
                                      if (iVar19 == 0) goto LAB_0013bb51;
                                      lVar15 = (long)pVVar26->cur_ - (long)pVVar26->buf_;
                                      uVar21 = (pVVar26->used_ + 7 >> 3) + lVar15;
                                      if (uVar21 < local_18f8) {
                                        iVar19 = ((int)puVar12 - ((int)puVar5 + iVar8)) +
                                                 ((int)local_18e0 + 7 >> 3);
                                        local_19c8->cache_bits_ = iVar10;
                                        iVar10 = local_19c0->used_;
                                        iVar8 = (int)local_1930;
                                        VP8LBitWriterSwap(local_19c0,(VP8LBitWriter *)idx_map);
                                        local_193c = ((int)lVar15 - (iVar8 + iVar19)) +
                                                     (iVar10 + 7 >> 3);
                                        local_1938 = iVar19;
                                        local_18f8 = uVar21;
                                      }
                                      WebPSafeFree(local_19d8);
                                      pHVar14 = local_1980;
                                      WebPSafeFree(local_1980->codes);
                                      WebPSafeFree(pHVar14);
                                      local_19d8 = (HuffmanTreeToken *)0x0;
                                      tmp_histo = (VP8LHistogram *)0x0;
                                      image_histo = (VP8LHistogramSet *)0x0;
                                      bVar16 = 0;
                                      pHVar14 = (HuffmanTreeCode *)0x0;
                                      lVar15 = local_1a00;
                                      uVar17 = local_1964;
                                    }
                                    goto LAB_0013b7ef;
                                  }
                                  VP8LOptimizeSampling
                                            (puVar20,(int)local_19f8,(int)local_1990,uVar17,9,
                                             (int *)&local_19a4);
                                  uVar25 = local_19a4;
                                  if (0x1f < pVVar26->used_) {
                                    VP8LPutBitsFlushBits(pVVar26);
                                  }
                                  pVVar26->bits_ =
                                       pVVar26->bits_ |
                                       (ulong)(uVar25 - 2) << ((byte)pVVar26->used_ & 0x3f);
                                  pVVar26->used_ = pVVar26->used_ + 3;
                                  iVar19 = 1 << ((byte)local_19a4 & 0x1f);
                                  iVar8 = (int)(((uint)(local_1998 >> 0x1f) & 1) + (int)local_1998)
                                          >> 1;
                                  local_1998 = (ulong)(uint)((int)local_1998 - iVar8);
                                  uVar25 = (uint)(iVar19 + local_1984) >> ((byte)local_19a4 & 0x1f);
                                  in_R9 = (HuffmanTreeCode *)(ulong)uVar25;
                                  iVar8 = EncodeImageNoHuffman
                                                    (pVVar26,puVar20,&hash_chain_histogram,
                                                     local_18d0,
                                                     (uint)(iVar19 + (int)local_18d8) >>
                                                     ((byte)local_19a4 & 0x1f),uVar25,
                                                     (int)local_1970,(int)local_19a0,local_19e8,
                                                     iVar8,&percent);
                                  if (iVar8 != 0) goto LAB_0013b968;
LAB_0013bb51:
                                  tmp_histo = (VP8LHistogram *)0x0;
                                  image_histo = (VP8LHistogramSet *)0x0;
                                  pHVar14 = local_1980;
                                }
                                bVar16 = 2;
                                lVar15 = local_1a00;
                              }
                            }
                          }
LAB_0013b7ef:
                          bVar36 = 0;
                          if (bVar16 != 0) {
                            if (bVar16 != 6) {
                              bVar36 = bVar16;
                            }
                            goto LAB_0013bb8a;
                          }
                          if ((lVar27 != 0) ||
                             (lVar27 = 1, *(int *)(local_1958 + 0xc + lVar15 * 8) == 0))
                          goto LAB_0013bb8a;
                        } while( true );
                      }
                      bVar36 = 2;
LAB_0013bb8a:
                      pVVar33 = local_19c8;
                      lVar27 = local_19b8;
                      if (bVar36 != 0) {
                        ptr = local_19d8;
                        if (bVar36 != 2) goto LAB_0013bc3c;
                        goto LAB_0013bbd1;
                      }
                      lVar15 = lVar15 + 1;
                      uVar21 = (ulong)*(int *)(local_1958 + 0x18);
                    } while (lVar15 < (long)uVar21);
                  }
                  VP8LBitWriterSwap(local_19c0,(VP8LBitWriter *)idx_map);
                  WebPReportProgress(local_19e8,local_1914 + (int)local_19d0,&percent);
                  ptr = local_19d8;
                }
LAB_0013bbd1:
                WebPSafeFree(ptr);
                WebPSafeFree(local_1960);
                VP8LFreeHistogramSet(image_histo);
                VP8LFreeHistogram(tmp_histo);
                VP8LHashChainClear(&hash_chain_histogram);
                if (pHVar14 != (HuffmanTreeCode *)0x0) {
                  WebPSafeFree(pHVar14->codes);
                  WebPSafeFree(pHVar14);
                }
                WebPSafeFree(puVar20);
                VP8LBitWriterWipeOut((VP8LBitWriter *)idx_map);
                bVar36 = local_19e8->error_code != VP8_ENC_OK;
LAB_0013bc3c:
                lVar15 = local_19b0;
                pVVar26 = local_19c0;
                if ((bVar36 & 1) != 0) goto LAB_0013bc4a;
                puVar12 = local_19c0->cur_ +
                          ((long)(local_19c0->used_ + 7 >> 3) - (long)local_19c0->buf_);
                if ((puVar12 < local_1928) &&
                   (VP8LBitWriterSwap(local_19c0,&bw_best), local_1928 = puVar12, local_18b8 != 0))
                {
                  *(undefined4 *)(local_18b8 + 0x94) = 0;
                  uVar17 = (uint)(pVVar33->use_predict_ != 0);
                  *(uint *)(local_18b8 + 0x94) = uVar17;
                  if (pVVar33->use_cross_color_ != 0) {
                    *(uint *)(local_18b8 + 0x94) = uVar17 | 2;
                  }
                  if (pVVar33->use_subtract_green_ != 0) {
                    *(byte *)(local_18b8 + 0x94) = *(byte *)(local_18b8 + 0x94) | 4;
                  }
                  if (pVVar33->use_palette_ != 0) {
                    *(byte *)(local_18b8 + 0x94) = *(byte *)(local_18b8 + 0x94) | 8;
                  }
                  *(undefined8 *)(local_18b8 + 0x98) = *(undefined8 *)&pVVar33->histo_bits_;
                  *(int *)(local_18b8 + 0xb4) = pVVar33->cross_color_transform_bits_;
                  *(int *)(local_18b8 + 0xa0) = pVVar33->cache_bits_;
                  *(int *)(local_18b8 + 0xa4) = pVVar33->palette_size_;
                  *(int *)(local_18b8 + 0xa8) = (int)puVar12 - (int)local_1930;
                  *(int *)(local_18b8 + 0xac) = local_1938;
                  *(int *)(local_18b8 + 0xb0) = local_193c;
                }
                bVar35 = true;
                if (1 < (int)local_1920) {
                  VP8LBitWriterReset(&bw_init,pVVar26);
                }
              }
              else {
                iVar19 = 100;
                if (pVVar33->use_palette_ == 0) {
                  iVar19 = pVVar33->config_->near_lossless;
                }
                local_19f0 = (uint32_t *)CONCAT44(local_19f0._4_4_,iVar19);
                iVar11 = pVVar33->current_width_;
                iVar24 = pVVar33->use_subtract_green_;
                height = (int)local_1990;
                max_bits = ClampBits(iVar11,height,pVVar33->predictor_transform_bits_,0x4000,iVar10,
                                     iVar8);
                pWVar4 = pVVar33->config_;
                iVar1 = pWVar4->method;
                iVar19 = iVar1 * 2 + -8;
                if (iVar1 < 5) {
                  iVar19 = 0;
                }
                iVar8 = ClampBits(iVar11,height,max_bits - iVar19,0x4000,iVar10,iVar8);
                in_R9 = (HuffmanTreeCode *)pVVar33->argb_;
                iVar10 = (int)puVar20 / 6;
                iVar8 = VP8LResidualImage(iVar11,height,iVar8,max_bits,(int)local_19a0,
                                          (uint32_t *)in_R9,pVVar33->argb_scratch_,
                                          pVVar33->transform_data_,(int)local_19f0,pWVar4->exact,
                                          iVar24,pVVar33->pic_,iVar10,&percent,(int *)buffer);
                lVar15 = local_19b0;
                pVVar26 = local_19c0;
                pVVar33 = local_19c8;
                if (iVar8 != 0) {
                  if (0x1f < local_19c0->used_) {
                    VP8LPutBitsFlushBits(local_19c0);
                  }
                  iVar8 = pVVar26->used_;
                  pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar8 & 0x3f);
                  pVVar26->used_ = iVar8 + 1;
                  if (0x1e < iVar8) {
                    VP8LPutBitsFlushBits(pVVar26);
                  }
                  iVar8 = pVVar26->used_;
                  pVVar26->used_ = iVar8 + 2;
                  uVar7 = buffer._0_4_;
                  if (0x1d < iVar8) {
                    VP8LPutBitsFlushBits(pVVar26);
                  }
                  pVVar33 = local_19c8;
                  pVVar26->bits_ =
                       pVVar26->bits_ | (ulong)(uVar7 - 2) << ((byte)pVVar26->used_ & 0x3f);
                  pVVar26->used_ = pVVar26->used_ + 3;
                  bVar36 = (byte)buffer._0_8_;
                  iVar19 = 1 << (bVar36 & 0x1f);
                  iVar8 = (int)puVar20 / 3;
                  uVar17 = (uint)(iVar19 + local_1984) >> (bVar36 & 0x1f);
                  in_R9 = (HuffmanTreeCode *)(ulong)uVar17;
                  local_19c8->predictor_transform_bits_ = buffer._0_4_;
                  iVar10 = EncodeImageNoHuffman
                                     (pVVar26,local_19c8->transform_data_,local_1948,local_1950,
                                      (iVar11 + iVar19) - 1U >> (bVar36 & 0x1f),uVar17,
                                      (int)local_1970,(int)local_19a0,local_19c8->pic_,
                                      iVar8 - iVar10,&percent);
                  if (iVar10 != 0) {
                    puVar20 = (uint32_t *)(ulong)(uint)((int)local_19d0 - iVar8);
                    lVar27 = local_19b8;
                    goto LAB_0013b1c9;
                  }
                }
LAB_0013bc50:
                bVar35 = false;
                lVar27 = local_19b8;
              }
              goto LAB_0013bd7f;
            }
            pWVar23 = pVVar33->pic_;
            iVar8 = pWVar23->width;
            iVar19 = pWVar23->height;
            iVar11 = AllocateTransformBuffer(pVVar33,iVar8,iVar19);
            iVar10 = (int)puVar20;
            lVar27 = local_19b8;
            if (iVar11 != 0) {
              if (pVVar33->argb_content_ != kEncoderARGB) {
                if (0 < iVar19) {
                  puVar34 = pWVar23->argb;
                  puVar22 = local_19c8->argb_;
                  do {
                    memcpy(puVar22,puVar34,(long)iVar8 * 4);
                    iVar10 = (int)puVar20;
                    puVar34 = puVar34 + pWVar23->argb_stride;
                    puVar22 = puVar22 + iVar8;
                    iVar19 = iVar19 + -1;
                  } while (iVar19 != 0);
                }
                local_19c8->argb_content_ = kEncoderARGB;
                pVVar26 = local_19c0;
              }
              pVVar33 = local_19c8;
              lVar27 = local_19b8;
              if (iVar11 != 0) goto LAB_0013af32;
            }
          }
          else {
            iVar10 = PaletteSort(*(PaletteSorting *)(local_1958 + 4),pVVar33->pic_,local_18a8,
                                 pVVar33->palette_size_,local_1978);
            if (iVar10 == 0) {
              pWVar23 = pVVar33->pic_;
              goto LAB_0013aa6c;
            }
            uVar17 = pVVar33->palette_size_;
            uVar9 = uVar17 - 1;
            if (pVVar33->palette_[(long)(int)uVar17 + -1] != 0) {
              uVar9 = uVar17;
            }
            if ((long)(int)uVar17 < 0x12) {
              uVar9 = uVar17;
            }
            puVar20 = (uint32_t *)(ulong)uVar9;
            if (0x1f < pVVar26->used_) {
              VP8LPutBitsFlushBits(pVVar26);
            }
            iVar10 = pVVar26->used_;
            pVVar26->bits_ = pVVar26->bits_ | 1L << ((byte)iVar10 & 0x3f);
            pVVar26->used_ = iVar10 + 1;
            if (0x1e < iVar10) {
              VP8LPutBitsFlushBits(pVVar26);
            }
            iVar10 = pVVar26->used_;
            pVVar26->bits_ = pVVar26->bits_ | 3L << ((byte)iVar10 & 0x3f);
            pVVar26->used_ = iVar10 + 2;
            if (0x1d < iVar10) {
              VP8LPutBitsFlushBits(pVVar26);
            }
            uVar17 = uVar9 - 1;
            pVVar26->bits_ = pVVar26->bits_ | (ulong)uVar17 << ((byte)pVVar26->used_ & 0x3f);
            pVVar26->used_ = pVVar26->used_ + 8;
            uVar21 = (ulong)uVar17;
            if (0 < (int)uVar17) {
              do {
                *(uint32_t *)(buffer + uVar21 * 2) =
                     (local_1978[uVar21] | 0xff00) - (local_1978[uVar21 - 1] & 0xff00ff) & 0xff00ff
                     | (local_1978[uVar21] | 0xff0000) - (local_1978[uVar21 - 1] & 0xff00ff00) &
                       0xff00ff00;
                bVar35 = 1 < (long)uVar21;
                uVar21 = uVar21 - 1;
              } while (bVar35);
            }
            buffer._0_4_ = pVVar33->palette_[0];
            in_R9 = (HuffmanTreeCode *)0x1;
            iVar10 = EncodeImageNoHuffman
                               (pVVar26,(uint32_t *)buffer,local_1948,local_1950,uVar9,1,0x14,
                                (int)local_19a0,pVVar33->pic_,(int)local_18b0,&percent);
            if (iVar10 != 0) {
              pWVar23 = pVVar33->pic_;
              uVar17 = pWVar23->width;
              pHVar31 = (HuffmanTree *)(long)(int)uVar17;
              uVar29 = pVVar33->palette_size_;
              uVar21 = (ulong)(int)uVar29;
              uVar9 = (uint)((long)uVar21 < 0x11);
              if ((long)uVar21 < 5) {
                uVar9 = (long)uVar21 < 3 | 2;
              }
              local_19d8 = (HuffmanTreeToken *)CONCAT44(local_19d8._4_4_,uVar9);
              local_1a00 = CONCAT44(local_1a00._4_4_,pWVar23->height);
              iVar10 = AllocateTransformBuffer
                                 (pVVar33,((1 << (sbyte)uVar9) + uVar17) - 1 >> (sbyte)uVar9,
                                  pWVar23->height);
              if (iVar10 != 0) {
                puVar34 = pWVar23->argb;
                local_19f8 = (ulong)(uint)pWVar23->argb_stride;
                local_19f0 = pVVar33->argb_;
                local_1998 = (ulong)(uint)pVVar33->current_width_;
                puVar12 = (uint8_t *)WebPSafeMalloc((uint64_t)pHVar31,1);
                pVVar33 = local_19c8;
                if (puVar12 != (uint8_t *)0x0) {
                  local_19d0 = (uint32_t *)(ulong)uVar17;
                  if ((int)uVar29 < 4) {
                    local_1960 = pHVar31;
                    if (0 < (int)local_1a00) {
                      uVar29 = *local_1978;
                      local_19f8 = local_19f8 << 2;
                      iVar10 = 0;
                      bVar36 = 0;
                      do {
                        puVar22 = local_19f0;
                        if (0 < (int)local_19d0) {
                          puVar13 = (undefined1 *)0x0;
                          do {
                            uVar30 = puVar34[(long)puVar13];
                            if (((uVar30 != uVar29) &&
                                (bVar36 = 0, uVar29 = uVar30, *local_1978 != uVar30)) &&
                               (bVar36 = 1, pVVar33->palette_[1] != uVar30)) {
                              bVar36 = pVVar33->palette_[2] == uVar30 ^ 3;
                            }
                            puVar12[(long)puVar13] = bVar36;
                            puVar13 = puVar13 + 1;
                          } while (local_19d0 != (uint32_t *)puVar13);
                        }
                        (*VP8LBundleColorMap)(puVar12,(int)local_1960,(int)local_19d8,local_19f0);
                        local_19f0 = puVar22 + local_1998;
                        iVar10 = iVar10 + 1;
                        puVar34 = (uint32_t *)((long)puVar34 + local_19f8);
                      } while (iVar10 != (int)local_1a00);
                    }
                  }
                  else {
                    lVar15 = 0;
                    do {
                      memset(buffer,0xff,0x1000);
                      pcVar3 = (code *)(&PTR_ApplyPaletteHash0_001fbc50)[lVar15];
                      uVar32 = 0;
                      do {
                        uVar17 = (*pcVar3)(local_1978[uVar32]);
                        pVVar33 = local_19c8;
                        puVar22 = local_19d0;
                        bVar35 = false;
                        if (buffer[uVar17] != 0xffff) break;
                        buffer[uVar17] = (uint16_t)uVar32;
                        uVar32 = uVar32 + 1;
                        bVar35 = true;
                      } while (uVar32 < uVar21);
                      if (bVar35) goto LAB_0013ab83;
                      lVar15 = lVar15 + 1;
                    } while (lVar15 != 3);
                    lVar15 = 3;
LAB_0013ab83:
                    iVar10 = (int)lVar15;
                    puVar20 = local_19d0;
                    if (iVar10 == 2) {
                      if (0 < (int)local_1a00) {
                        uVar17 = *local_1978;
                        local_19f8 = local_19f8 << 2;
                        uVar28 = 0;
                        iVar10 = 0;
                        do {
                          puVar20 = local_19f0;
                          if (0 < (int)local_19d0) {
                            puVar13 = (undefined1 *)0x0;
                            do {
                              uVar9 = puVar34[(long)puVar13];
                              if (uVar9 != uVar17) {
                                uVar28 = buffer[uVar9 * -0x80000000 - (uVar9 & 0xffffff) >> 0x15];
                                uVar17 = uVar9;
                              }
                              puVar12[(long)puVar13] = (uint8_t)uVar28;
                              puVar13 = puVar13 + 1;
                            } while (local_19d0 != (uint32_t *)puVar13);
                          }
                          (*VP8LBundleColorMap)(puVar12,(int)local_19d0,(int)local_19d8,local_19f0);
                          local_19f0 = puVar20 + local_1998;
                          iVar10 = iVar10 + 1;
                          puVar34 = (uint32_t *)((long)puVar34 + local_19f8);
                          puVar20 = local_19d0;
                        } while (iVar10 != (int)local_1a00);
                      }
                    }
                    else if (iVar10 == 1) {
                      if (0 < (int)local_1a00) {
                        uVar17 = *local_1978;
                        local_19f8 = local_19f8 << 2;
                        uVar28 = 0;
                        iVar10 = 0;
                        do {
                          puVar20 = local_19f0;
                          if (0 < (int)local_19d0) {
                            puVar13 = (undefined1 *)0x0;
                            do {
                              uVar9 = puVar34[(long)puVar13];
                              if (uVar9 != uVar17) {
                                uVar28 = buffer[(uVar9 & 0xffffff) * -0x455ab19 >> 0x15];
                                uVar17 = uVar9;
                              }
                              puVar12[(long)puVar13] = (uint8_t)uVar28;
                              puVar13 = puVar13 + 1;
                            } while (local_19d0 != (uint32_t *)puVar13);
                          }
                          (*VP8LBundleColorMap)(puVar12,(int)local_19d0,(int)local_19d8,local_19f0);
                          local_19f0 = puVar20 + local_1998;
                          iVar10 = iVar10 + 1;
                          puVar34 = (uint32_t *)((long)puVar34 + local_19f8);
                          puVar20 = local_19d0;
                        } while (iVar10 != (int)local_1a00);
                      }
                    }
                    else if (iVar10 == 0) {
                      if (0 < (int)local_1a00) {
                        uVar17 = *local_1978;
                        local_19f8 = local_19f8 << 2;
                        uVar28 = 0;
                        iVar10 = 0;
                        do {
                          puVar20 = local_19f0;
                          if (0 < (int)local_19d0) {
                            puVar13 = (undefined1 *)0x0;
                            do {
                              uVar9 = puVar34[(long)puVar13];
                              if (uVar9 != uVar17) {
                                uVar28 = buffer[uVar9 >> 8 & 0xff];
                                uVar17 = uVar9;
                              }
                              puVar12[(long)puVar13] = (uint8_t)uVar28;
                              puVar13 = puVar13 + 1;
                            } while (local_19d0 != (uint32_t *)puVar13);
                          }
                          (*VP8LBundleColorMap)(puVar12,(int)local_19d0,(int)local_19d8,local_19f0);
                          local_19f0 = puVar20 + local_1998;
                          iVar10 = iVar10 + 1;
                          puVar34 = (uint32_t *)((long)puVar34 + local_19f8);
                          puVar20 = local_19d0;
                        } while (iVar10 != (int)local_1a00);
                      }
                    }
                    else {
                      PrepareMapToPalette(local_1978,uVar29,(uint32_t *)&hash_chain_histogram,
                                          idx_map);
                      pVVar33 = local_19c8;
                      if (0 < (int)local_1a00) {
                        uVar30 = *local_1978;
                        local_19f8 = local_19f8 << 2;
                        uVar18 = 0;
                        iVar10 = 0;
                        do {
                          local_1960 = (HuffmanTree *)CONCAT44(local_1960._4_4_,iVar10);
                          if (0 < (int)puVar22) {
                            puVar13 = (undefined1 *)0x0;
                            do {
                              color = puVar34[(long)puVar13];
                              if (color != uVar30) {
                                iVar10 = SearchColorNoIdx((uint32_t *)&hash_chain_histogram,color,
                                                          uVar29);
                                uVar18 = idx_map[iVar10];
                                puVar22 = local_19d0;
                                uVar30 = color;
                              }
                              puVar12[(long)puVar13] = (uint8_t)uVar18;
                              puVar13 = puVar13 + 1;
                            } while (puVar22 != (uint32_t *)puVar13);
                          }
                          puVar6 = local_19f0;
                          (*VP8LBundleColorMap)(puVar12,(int)puVar22,(int)local_19d8,local_19f0);
                          local_19f0 = puVar6 + local_1998;
                          iVar10 = (int)local_1960 + 1;
                          puVar34 = (uint32_t *)((long)puVar34 + local_19f8);
                          pVVar33 = local_19c8;
                        } while (iVar10 != (int)local_1a00);
                      }
                    }
                  }
                  WebPSafeFree(puVar12);
                  pVVar26 = local_19c0;
LAB_0013ae60:
                  pVVar33->argb_content_ = kEncoderPalette;
                  uVar17 = pVVar33->palette_size_;
                  uVar21 = (ulong)local_1934;
                  lVar27 = local_19b8;
                  if ((int)uVar17 < 0x400) {
                    uVar9 = 0x1f;
                    if (uVar17 != 0) {
                      for (; uVar17 >> uVar9 == 0; uVar9 = uVar9 - 1) {
                      }
                    }
                    pVVar33->cache_bits_ = (uVar9 ^ 0xffffffe0) + 0x21;
                    uVar21 = (ulong)local_1934;
                  }
                  goto LAB_0013ae95;
                }
                iVar10 = WebPEncodingSetError(pWVar23,VP8_ENC_ERROR_OUT_OF_MEMORY);
                lVar15 = local_19b0;
                pVVar33 = local_19c8;
                if (iVar10 != 0) goto LAB_0013ae60;
                goto LAB_0013bc50;
              }
            }
          }
LAB_0013bd75:
          bVar35 = false;
          lVar15 = local_19b0;
        }
LAB_0013bd7f:
        if (!bVar35) goto LAB_0013be1a;
        uVar21 = local_19e0 + 1;
      } while (uVar21 != local_1920);
    }
    VP8LBitWriterSwap(&bw_best,pVVar26);
  }
LAB_0013be1a:
  VP8LBitWriterWipeOut(&bw_best);
  return (int)(*(int *)(*(long *)((long)local_18e8 + 8) + 0x88) == 0);
}

Assistant:

static int EncodeStreamHook(void* input, void* data2) {
  StreamEncodeContext* const params = (StreamEncodeContext*)input;
  const WebPConfig* const config = params->config_;
  const WebPPicture* const picture = params->picture_;
  VP8LBitWriter* const bw = params->bw_;
  VP8LEncoder* const enc = params->enc_;
  const CrunchConfig* const crunch_configs = params->crunch_configs_;
  const int num_crunch_configs = params->num_crunch_configs_;
  const int red_and_blue_always_zero = params->red_and_blue_always_zero_;
#if !defined(WEBP_DISABLE_STATS)
  WebPAuxStats* const stats = params->stats_;
#endif
  const int quality = (int)config->quality;
  const int low_effort = (config->method == 0);
#if (WEBP_NEAR_LOSSLESS == 1)
  const int width = picture->width;
#endif
  const int height = picture->height;
  const size_t byte_position = VP8LBitWriterNumBytes(bw);
  int percent = 2;  // for WebPProgressHook
#if (WEBP_NEAR_LOSSLESS == 1)
  int use_near_lossless = 0;
#endif
  int hdr_size = 0;
  int data_size = 0;
  int idx;
  size_t best_size = ~(size_t)0;
  VP8LBitWriter bw_init = *bw, bw_best;
  (void)data2;

  if (!VP8LBitWriterInit(&bw_best, 0) ||
      (num_crunch_configs > 1 && !VP8LBitWriterClone(bw, &bw_best))) {
    WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
    goto Error;
  }

  for (idx = 0; idx < num_crunch_configs; ++idx) {
    const int entropy_idx = crunch_configs[idx].entropy_idx_;
    int remaining_percent = 97 / num_crunch_configs, percent_range;
    enc->use_palette_ =
        (entropy_idx == kPalette) || (entropy_idx == kPaletteAndSpatial);
    enc->use_subtract_green_ =
        (entropy_idx == kSubGreen) || (entropy_idx == kSpatialSubGreen);
    enc->use_predict_ = (entropy_idx == kSpatial) ||
                        (entropy_idx == kSpatialSubGreen) ||
                        (entropy_idx == kPaletteAndSpatial);
    // When using a palette, R/B==0, hence no need to test for cross-color.
    if (low_effort || enc->use_palette_) {
      enc->use_cross_color_ = 0;
    } else {
      enc->use_cross_color_ = red_and_blue_always_zero ? 0 : enc->use_predict_;
    }
    // Reset any parameter in the encoder that is set in the previous iteration.
    enc->cache_bits_ = 0;
    VP8LBackwardRefsClear(&enc->refs_[0]);
    VP8LBackwardRefsClear(&enc->refs_[1]);

#if (WEBP_NEAR_LOSSLESS == 1)
    // Apply near-lossless preprocessing.
    use_near_lossless = (config->near_lossless < 100) && !enc->use_palette_ &&
                        !enc->use_predict_;
    if (use_near_lossless) {
      if (!AllocateTransformBuffer(enc, width, height)) goto Error;
      if ((enc->argb_content_ != kEncoderNearLossless) &&
          !VP8ApplyNearLossless(picture, config->near_lossless, enc->argb_)) {
        WebPEncodingSetError(picture, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      enc->argb_content_ = kEncoderNearLossless;
    } else {
      enc->argb_content_ = kEncoderNone;
    }
#else
    enc->argb_content_ = kEncoderNone;
#endif

    // Encode palette
    if (enc->use_palette_) {
      if (!PaletteSort(crunch_configs[idx].palette_sorting_type_, enc->pic_,
                       enc->palette_sorted_, enc->palette_size_,
                       enc->palette_)) {
        WebPEncodingSetError(enc->pic_, VP8_ENC_ERROR_OUT_OF_MEMORY);
        goto Error;
      }
      percent_range = remaining_percent / 4;
      if (!EncodePalette(bw, low_effort, enc, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
      if (!MapImageFromPalette(enc)) goto Error;
      // If using a color cache, do not have it bigger than the number of
      // colors.
      if (enc->palette_size_ < (1 << MAX_COLOR_CACHE_BITS)) {
        enc->cache_bits_ = BitsLog2Floor(enc->palette_size_) + 1;
      }
    }
    // In case image is not packed.
    if (enc->argb_content_ != kEncoderNearLossless &&
        enc->argb_content_ != kEncoderPalette) {
      if (!MakeInputImageCopy(enc)) goto Error;
    }

    // -------------------------------------------------------------------------
    // Apply transforms and write transform data.

    if (enc->use_subtract_green_) {
      ApplySubtractGreen(enc, enc->current_width_, height, bw);
    }

    if (enc->use_predict_) {
      percent_range = remaining_percent / 3;
      if (!ApplyPredictFilter(enc, enc->current_width_, height, quality,
                              low_effort, enc->use_subtract_green_, bw,
                              percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    if (enc->use_cross_color_) {
      percent_range = remaining_percent / 2;
      if (!ApplyCrossColorFilter(enc, enc->current_width_, height, quality,
                                 low_effort, bw, percent_range, &percent)) {
        goto Error;
      }
      remaining_percent -= percent_range;
    }

    VP8LPutBits(bw, !TRANSFORM_PRESENT, 1);  // No more transforms.

    // -------------------------------------------------------------------------
    // Encode and write the transformed image.
    if (!EncodeImageInternal(
            bw, enc->argb_, &enc->hash_chain_, enc->refs_, enc->current_width_,
            height, quality, low_effort, &crunch_configs[idx],
            &enc->cache_bits_, enc->histo_bits_, byte_position, &hdr_size,
            &data_size, picture, remaining_percent, &percent)) {
      goto Error;
    }

    // If we are better than what we already have.
    if (VP8LBitWriterNumBytes(bw) < best_size) {
      best_size = VP8LBitWriterNumBytes(bw);
      // Store the BitWriter.
      VP8LBitWriterSwap(bw, &bw_best);
#if !defined(WEBP_DISABLE_STATS)
      // Update the stats.
      if (stats != NULL) {
        stats->lossless_features = 0;
        if (enc->use_predict_) stats->lossless_features |= 1;
        if (enc->use_cross_color_) stats->lossless_features |= 2;
        if (enc->use_subtract_green_) stats->lossless_features |= 4;
        if (enc->use_palette_) stats->lossless_features |= 8;
        stats->histogram_bits = enc->histo_bits_;
        stats->transform_bits = enc->predictor_transform_bits_;
        stats->cross_color_transform_bits = enc->cross_color_transform_bits_;
        stats->cache_bits = enc->cache_bits_;
        stats->palette_size = enc->palette_size_;
        stats->lossless_size = (int)(best_size - byte_position);
        stats->lossless_hdr_size = hdr_size;
        stats->lossless_data_size = data_size;
      }
#endif
    }
    // Reset the bit writer for the following iteration if any.
    if (num_crunch_configs > 1) VP8LBitWriterReset(&bw_init, bw);
  }
  VP8LBitWriterSwap(&bw_best, bw);

 Error:
  VP8LBitWriterWipeOut(&bw_best);
  // The hook should return false in case of error.
  return (params->picture_->error_code == VP8_ENC_OK);
}